

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.h
# Opt level: O2

void __thiscall
cppcms::impl::details::
basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
::check(basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        *this)

{
  container *pcVar1;
  range_type *prVar2;
  pointer ppVar3;
  size_t sVar4;
  ostream *poVar5;
  runtime_error *prVar6;
  container *pcVar7;
  pointer ppVar8;
  pointer ppVar9;
  ulong uVar10;
  container *pcVar11;
  size_t sVar12;
  hasher h;
  string local_1c8 [32];
  ostringstream oss;
  
  sVar12 = 0;
  pcVar11 = (this->list_).begin;
  do {
    if (pcVar11 == (container *)0x0) {
      if (this->size_ != sVar12) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar5 = std::operator<<((ostream *)&oss,"Error ");
        poVar5 = std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/hash_map.h"
                                );
        poVar5 = std::operator<<(poVar5,":");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x126);
        std::operator<<(poVar5," size_ == count");
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar6,local_1c8);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      ppVar8 = (this->hash_).
               super__Vector_base<std::pair<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*,_cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*>,_std::allocator<std::pair<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*,_cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar9 = (this->hash_).
               super__Vector_base<std::pair<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*,_cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*>,_std::allocator<std::pair<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*,_cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      sVar12 = 0;
      uVar10 = 0;
      do {
        if ((ulong)((long)ppVar9 - (long)ppVar8 >> 4) <= uVar10) {
          if (this->size_ == sVar12) {
            return;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
          poVar5 = std::operator<<((ostream *)&oss,"Error ");
          poVar5 = std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/hash_map.h"
                                  );
          poVar5 = std::operator<<(poVar5,":");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x131);
          std::operator<<(poVar5," size_ == count");
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar6,local_1c8);
          __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        ppVar3 = ppVar8 + uVar10;
        do {
          pcVar11 = ppVar3->first;
          if (pcVar11 == (container *)0x0) break;
          sVar4 = hasher::operator()(&h,(string *)pcVar11);
          ppVar8 = (this->hash_).
                   super__Vector_base<std::pair<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*,_cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*>,_std::allocator<std::pair<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*,_cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppVar9 = (this->hash_).
                   super__Vector_base<std::pair<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*,_cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*>,_std::allocator<std::pair<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*,_cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (sVar4 % (ulong)((long)ppVar9 - (long)ppVar8 >> 4) != uVar10) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
            poVar5 = std::operator<<((ostream *)&oss,"Error ");
            poVar5 = std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/hash_map.h"
                                    );
            poVar5 = std::operator<<(poVar5,":");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,300);
            std::operator<<(poVar5," h(p->val.first) % hash_.size() == i");
            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar6,local_1c8);
            __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          sVar12 = sVar12 + 1;
          ppVar3 = (pointer)&pcVar11->next;
        } while (pcVar11 != ppVar8[uVar10].second);
        uVar10 = uVar10 + 1;
      } while( true );
    }
    prVar2 = basic_map<std::__cxx11::string,int,hasher,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,int>>>
             ::get<std::__cxx11::string>
                       ((basic_map<std::__cxx11::string,int,hasher,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,int>>>
                         *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )pcVar11);
    pcVar7 = prVar2->first;
    pcVar1 = prVar2->second;
    if (pcVar7 != pcVar11 && pcVar7 == pcVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar5 = std::operator<<((ostream *)&oss,"Error ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/hash_map.h"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x116);
      std::operator<<(poVar5," r.first==p");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,local_1c8);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    for (; pcVar7 != pcVar1; pcVar7 = pcVar7->next) {
      if (pcVar7 == pcVar11) goto LAB_00108e9b;
    }
    if (pcVar1 != pcVar11) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar5 = std::operator<<((ostream *)&oss,"Error ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/hash_map.h"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x121);
      std::operator<<(poVar5," p2 == p");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,local_1c8);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
LAB_00108e9b:
    if ((pcVar11->next == (container *)0x0) && (pcVar11 != (this->list_).end)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar5 = std::operator<<((ostream *)&oss,"Error ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/hash_map.h"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x123);
      std::operator<<(poVar5," p == list_.end");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,local_1c8);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    sVar12 = sVar12 + 1;
    pcVar11 = pcVar11->next;
  } while( true );
}

Assistant:

void check()
	{
		size_t count = 0;
		for(iterator p=list_.begin;p!=0;p=p->next,count++) {
			range_type &r = get(p->val.first);
			if(r.first == r.second) {
				TEST(r.first==p);
			}
			bool found = false;
			iterator p2;
			for(p2=r.first;p2!=r.second;p2=p2->next) {
				if(p2 == p) {
					found = true;
					break;
				}
			}
			if(!found)
				TEST(p2 == p);
			if(p->next == 0) {
				TEST(p == list_.end);
			}
		}
		TEST(size_ == count);
		count = 0;
		for(size_t i=0;i<hash_.size();i++) {
			for(iterator p=hash_[i].first;p;p=p->next) {
				count++;
				Hash h;
				TEST(h(p->val.first) % hash_.size() == i);
				if(p==hash_[i].second)
					break;
			}
		}
		TEST(size_ == count);
	}